

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O3

void __thiscall BoundaryElement::clear_cluster_potentials(BoundaryElement *this)

{
  Timers_BoundaryElement *pTVar1;
  pointer pdVar2;
  pointer pdVar3;
  rep rVar4;
  long lVar5;
  
  pTVar1 = this->timers_;
  rVar4 = std::chrono::_V2::steady_clock::now();
  (pTVar1->clear_cluster_potentials).start_time_.__d.__r = rVar4;
  pdVar2 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  pdVar2 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  pdVar2 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  pdVar2 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar3) {
    memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
  }
  pTVar1 = this->timers_;
  lVar5 = std::chrono::_V2::steady_clock::now();
  (pTVar1->clear_cluster_potentials).end_time_.__d.__r = lVar5;
  (pTVar1->clear_cluster_potentials).elapsed_time_.__r =
       (double)(lVar5 - (pTVar1->clear_cluster_potentials).start_time_.__d.__r) / 1000000.0 +
       (pTVar1->clear_cluster_potentials).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::clear_cluster_potentials()
{
    timers_.clear_cluster_potentials.start();

#ifdef OPENACC_ENABLED
    std::size_t num_potentials = num_charges_;
    double* __restrict clusters_p_ptr    = interp_potential_.data();
    double* __restrict clusters_p_dx_ptr = interp_potential_dx_.data();
    double* __restrict clusters_p_dy_ptr = interp_potential_dy_.data();
    double* __restrict clusters_p_dz_ptr = interp_potential_dz_.data();
    
    #pragma acc parallel loop present(clusters_p_ptr, clusters_p_dx_ptr, \
                                      clusters_p_dy_ptr, clusters_p_dz_ptr)
    for (std::size_t i = 0; i < num_potentials; ++i) {
        clusters_p_ptr[i] = 0.;
        clusters_p_dx_ptr[i] = 0.;
        clusters_p_dy_ptr[i] = 0.;
        clusters_p_dz_ptr[i] = 0.;
    }
#else
    std::fill(interp_potential_.begin(),    interp_potential_.end(),    0);
    std::fill(interp_potential_dx_.begin(), interp_potential_dx_.end(), 0);
    std::fill(interp_potential_dy_.begin(), interp_potential_dy_.end(), 0);
    std::fill(interp_potential_dz_.begin(), interp_potential_dz_.end(), 0);
#endif

    timers_.clear_cluster_potentials.stop();
}